

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O3

int jrtplib::GetAutoSockets
              (uint32_t bindIP,bool allowOdd,bool rtcpMux,SocketType *pRtpSock,SocketType *pRtcpSock
              ,uint16_t *pRtpPort,uint16_t *pRtcpPort)

{
  ushort uVar1;
  int iVar2;
  SocketType SVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  vector<int,_std::allocator<int>_> toClose;
  SocketType sock2;
  SocketType local_80;
  uint16_t local_7a;
  int *local_78;
  iterator iStack_70;
  int *local_68;
  int local_5c;
  sockaddr local_58;
  int *local_48;
  int *local_40;
  ushort *local_38;
  
  local_78 = (int *)0x0;
  iStack_70._M_current = (int *)0x0;
  local_68 = (int *)0x0;
  uVar6 = bindIP >> 0x18 | (bindIP & 0xff0000) >> 8 | (bindIP & 0xff00) << 8 | bindIP << 0x18;
  iVar8 = 0x400;
  local_48 = pRtpSock;
  local_40 = pRtcpSock;
  local_38 = pRtpPort;
LAB_0012a3a3:
  local_80 = socket(2,2,0);
  if (local_80 == -1) {
    if (iStack_70._M_current != local_78) {
      uVar7 = 0;
      do {
        close(local_78[uVar7]);
        uVar7 = uVar7 + 1;
      } while (uVar7 < (ulong)((long)iStack_70._M_current - (long)local_78 >> 2));
    }
    iVar2 = -0x4b;
    goto LAB_0012a736;
  }
  local_58.sa_data[6] = '\0';
  local_58.sa_data[7] = '\0';
  local_58.sa_data[8] = '\0';
  local_58.sa_data[9] = '\0';
  local_58.sa_data[10] = '\0';
  local_58.sa_data[0xb] = '\0';
  local_58.sa_data[0xc] = '\0';
  local_58.sa_data[0xd] = '\0';
  local_58.sa_family = 2;
  local_58.sa_data[0] = '\0';
  local_58.sa_data[1] = '\0';
  local_58.sa_data._2_4_ = uVar6;
  iVar2 = bind(local_80,&local_58,0x10);
  if (iVar2 != 0) {
    close(local_80);
    if (iStack_70._M_current != local_78) {
      uVar7 = 0;
      do {
        close(local_78[uVar7]);
        uVar7 = uVar7 + 1;
      } while (uVar7 < (ulong)((long)iStack_70._M_current - (long)local_78 >> 2));
    }
    iVar2 = -0xa0;
    goto LAB_0012a736;
  }
  local_7a = 0;
  iVar2 = GetIPv4SocketPort(local_80,&local_7a);
  if (iVar2 < 0) {
    close(local_80);
    if (iStack_70._M_current != local_78) {
      uVar7 = 0;
      do {
        close(local_78[uVar7]);
        uVar7 = uVar7 + 1;
      } while (uVar7 < (ulong)((long)iStack_70._M_current - (long)local_78 >> 2));
    }
    goto LAB_0012a736;
  }
  if (rtcpMux) {
    if (((local_7a & 1) == 0) || (allowOdd)) {
      *local_48 = local_80;
      *local_40 = local_80;
      *local_38 = local_7a;
      *pRtcpPort = local_7a;
      if (iStack_70._M_current != local_78) {
        uVar7 = 0;
        do {
          close(local_78[uVar7]);
          uVar7 = uVar7 + 1;
        } while (uVar7 < (ulong)((long)iStack_70._M_current - (long)local_78 >> 2));
      }
      goto LAB_0012a734;
    }
    SVar3 = local_80;
    if (iStack_70._M_current != local_68) goto LAB_0012a4fe;
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_78,iStack_70,&local_80);
  }
  else {
    local_5c = socket(2,2,0);
    if (local_5c == -1) {
      close(local_80);
      iVar2 = -0x4b;
      if (iStack_70._M_current != local_78) {
        uVar7 = 0;
        do {
          close(local_78[uVar7]);
          uVar7 = uVar7 + 1;
        } while (uVar7 < (ulong)((long)iStack_70._M_current - (long)local_78 >> 2));
      }
      goto LAB_0012a736;
    }
    if ((local_7a & 1) == 0) {
      uVar4 = local_7a | 1;
LAB_0012a474:
      local_58.sa_data[6] = '\0';
      local_58.sa_data[7] = '\0';
      local_58.sa_data[8] = '\0';
      local_58.sa_data[9] = '\0';
      local_58.sa_data[10] = '\0';
      local_58.sa_data[0xb] = '\0';
      local_58.sa_data[0xc] = '\0';
      local_58.sa_data[0xd] = '\0';
      local_58.sa_data._0_2_ = uVar4 << 8 | uVar4 >> 8;
      local_58.sa_family = 2;
      local_58.sa_data._2_4_ = uVar6;
      iVar2 = bind(local_5c,&local_58,0x10);
      if (iVar2 == 0) {
        uVar5 = uVar4;
        if (uVar4 < local_7a) {
          uVar5 = local_7a;
        }
        iVar8 = local_5c;
        uVar1 = uVar4;
        if (local_7a < uVar4) {
          iVar8 = local_80;
          uVar1 = local_7a;
        }
        *local_48 = iVar8;
        iVar8 = local_80;
        if (local_7a < uVar4) {
          iVar8 = local_5c;
        }
        *local_40 = iVar8;
        *local_38 = uVar1;
        *pRtcpPort = uVar5;
        if (iStack_70._M_current != local_78) {
          uVar7 = 0;
          do {
            close(local_78[uVar7]);
            uVar7 = uVar7 + 1;
          } while (uVar7 < (ulong)((long)iStack_70._M_current - (long)local_78 >> 2));
        }
LAB_0012a734:
        iVar2 = 0;
        goto LAB_0012a736;
      }
    }
    else if (1 < local_7a) {
      uVar4 = local_7a - 1;
      goto LAB_0012a474;
    }
    if (iStack_70._M_current == local_68) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_78,iStack_70,&local_80);
    }
    else {
      *iStack_70._M_current = local_80;
      iStack_70._M_current = iStack_70._M_current + 1;
    }
    SVar3 = local_5c;
    if (iStack_70._M_current == local_68) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_78,iStack_70,&local_5c);
    }
    else {
LAB_0012a4fe:
      *iStack_70._M_current = SVar3;
      iStack_70._M_current = iStack_70._M_current + 1;
    }
  }
  iVar8 = iVar8 + -1;
  if (iVar8 == 0) goto code_r0x0012a523;
  goto LAB_0012a3a3;
code_r0x0012a523:
  iVar2 = -0xa1;
  if (iStack_70._M_current != local_78) {
    uVar7 = 0;
    do {
      close(local_78[uVar7]);
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)iStack_70._M_current - (long)local_78 >> 2));
  }
LAB_0012a736:
  if (local_78 != (int *)0x0) {
    operator_delete(local_78,(long)local_68 - (long)local_78);
  }
  return iVar2;
}

Assistant:

int GetAutoSockets(uint32_t bindIP, bool allowOdd, bool rtcpMux,
                   SocketType *pRtpSock, SocketType *pRtcpSock, 
                   uint16_t *pRtpPort, uint16_t *pRtcpPort)
{
	const int maxAttempts = 1024;
	int attempts = 0;
	vector<SocketType> toClose;

	while (attempts++ < maxAttempts)
	{
		SocketType sock = socket(PF_INET, SOCK_DGRAM, 0);
		if (sock == RTPSOCKERR)
		{
			for (size_t i = 0 ; i < toClose.size() ; i++)
				RTPCLOSE(toClose[i]);
			return ERR_RTP_UDPV4TRANS_CANTCREATESOCKET;
		}

		// First we get an automatically chosen port

		struct sockaddr_in addr;
		memset(&addr,0,sizeof(struct sockaddr_in));

		addr.sin_family = AF_INET;
		addr.sin_port = 0;
		addr.sin_addr.s_addr = htonl(bindIP);
		if (bind(sock,(struct sockaddr *)&addr,sizeof(struct sockaddr_in)) != 0)
		{
			RTPCLOSE(sock);
			for (size_t i = 0 ; i < toClose.size() ; i++)
				RTPCLOSE(toClose[i]);
			return ERR_RTP_UDPV4TRANS_CANTGETVALIDSOCKET;
		}

		uint16_t basePort = 0;
		int status = GetIPv4SocketPort(sock, &basePort);
		if (status < 0)
		{
			RTPCLOSE(sock);
			for (size_t i = 0 ; i < toClose.size() ; i++)
				RTPCLOSE(toClose[i]);
			return status;
		}

		if (rtcpMux) // only need one socket
		{
			if (basePort%2 == 0 || allowOdd)
			{
				*pRtpSock = sock;
				*pRtcpSock = sock;
				*pRtpPort = basePort;
				*pRtcpPort = basePort;
				for (size_t i = 0 ; i < toClose.size() ; i++)
					RTPCLOSE(toClose[i]);

				return 0;
			}
			else
				toClose.push_back(sock);
		}
		else
		{
			SocketType sock2 = socket(PF_INET, SOCK_DGRAM, 0);
			if (sock2 == RTPSOCKERR)
			{
				RTPCLOSE(sock);
				for (size_t i = 0 ; i < toClose.size() ; i++)
					RTPCLOSE(toClose[i]);
				return ERR_RTP_UDPV4TRANS_CANTCREATESOCKET;
			}

			// Try the next port or the previous port
			uint16_t secondPort = basePort;
			bool possiblyValid = false;

			if (basePort%2 == 0)
			{
				secondPort++;
				possiblyValid = true;
			}
			else if (basePort > 1) // avoid landing on port 0
			{
				secondPort--;
				possiblyValid = true;
			}

			if (possiblyValid)
			{
				memset(&addr,0,sizeof(struct sockaddr_in));

				addr.sin_family = AF_INET;
				addr.sin_port = htons(secondPort);
				addr.sin_addr.s_addr = htonl(bindIP);
				if (bind(sock2,(struct sockaddr *)&addr,sizeof(struct sockaddr_in)) == 0)
				{
					// In this case, we have two consecutive port numbers, the lower of
					// which is even

					if (basePort < secondPort)
					{
						*pRtpSock = sock;
						*pRtcpSock = sock2;
						*pRtpPort = basePort;
						*pRtcpPort = secondPort;
					}
					else
					{
						*pRtpSock = sock2;
						*pRtcpSock = sock;
						*pRtpPort = secondPort;
						*pRtcpPort = basePort;
					}

					for (size_t i = 0 ; i < toClose.size() ; i++)
						RTPCLOSE(toClose[i]);

					return 0;
				}
			}

			toClose.push_back(sock);
			toClose.push_back(sock2);
		}
	}

	for (size_t i = 0 ; i < toClose.size() ; i++)
		RTPCLOSE(toClose[i]);

	return ERR_RTP_UDPV4TRANS_TOOMANYATTEMPTSCHOOSINGSOCKET;
}